

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall
ON_SubDEdgeSharpness::SetEdgeChainSharpness
          (ON_SubDEdgeSharpness *this,ON_Interval chain_sharpness_range,uint edge_count,
          ON_SubDEdgeSharpness *chain_edge_sharpness)

{
  double sharpness;
  uint uVar1;
  double *pdVar2;
  ulong uVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  float *pfVar5;
  ulong uVar6;
  float fVar7;
  double dVar8;
  ON_SubDEdgeSharpness OVar9;
  double dVar10;
  ON_Interval r;
  ON_Interval local_58;
  double local_48;
  ON_Interval local_40;
  
  pfVar5 = (float *)CONCAT44(in_register_00000034,edge_count);
  local_58.m_t[0] = chain_sharpness_range.m_t[0];
  uVar6 = (ulong)this & 0xffffffff;
  local_58.m_t[1] = chain_sharpness_range.m_t[1];
  uVar1 = (uint)this;
  uVar4 = 0;
  if (pfVar5 != (float *)0x0 && 1 < uVar1 + 1) {
    uVar4 = 0;
    pdVar2 = ON_Interval::operator[](&local_58,0);
    dVar10 = *pdVar2;
    pdVar2 = ON_Interval::operator[](&local_58,1);
    dVar8 = *pdVar2;
    pdVar2 = ON_Interval::operator[](&local_58,0);
    sharpness = *pdVar2;
    if ((dVar10 != dVar8) || (NAN(dVar10) || NAN(dVar8))) {
      if (sharpness <= 4.0 && 0.0 <= sharpness) {
        pdVar2 = ON_Interval::operator[](&local_58,1);
        dVar10 = ON_DBL_QNAN;
        if ((0.0 <= *pdVar2) && (*pdVar2 <= 4.0)) {
          local_48 = (double)uVar6;
          pdVar2 = ON_Interval::operator[](&local_58,0);
          ON_Interval::ON_Interval(&local_40,dVar10,*pdVar2);
          uVar3 = 1;
          do {
            local_40.m_t[0] = local_40.m_t[1];
            if (uVar3 < uVar6) {
              local_40.m_t[1] =
                   ON_Interval::ParameterAt(&local_58,(double)(uVar3 & 0xffffffff) / local_48);
            }
            else {
              pdVar2 = ON_Interval::operator[](&local_58,1);
              local_40.m_t[1] = *pdVar2;
            }
            dVar10 = ON_Interval::operator[](&local_40,0);
            dVar8 = ON_Interval::operator[](&local_40,1);
            OVar9 = FromInterval(dVar10,dVar8);
            if (OVar9.m_edge_sharpness[0] < 0.0) {
              return 0;
            }
            if (4.0 < OVar9.m_edge_sharpness[0]) {
              return 0;
            }
            if (OVar9.m_edge_sharpness[1] < 0.0) {
              return 0;
            }
            if (4.0 < OVar9.m_edge_sharpness[1]) {
              return 0;
            }
            *(float (*) [2])(pfVar5 + uVar3 * 2 + -2) = OVar9.m_edge_sharpness;
            uVar3 = uVar3 + 1;
          } while ((int)uVar3 - uVar1 != 1);
          uVar4 = 1;
          if (*pfVar5 != pfVar5[(ulong)(uVar1 - 1) * 2 + 1]) {
            uVar4 = uVar1;
          }
          if (NAN(*pfVar5) || NAN(pfVar5[(ulong)(uVar1 - 1) * 2 + 1])) {
            uVar4 = uVar1;
          }
        }
      }
    }
    else {
      if (sharpness <= 4.0 && 0.0 <= sharpness) {
        dVar10 = Sanitize(sharpness,0.0);
        fVar7 = (float)dVar10;
      }
      else {
        fVar7 = ON_FLT_QNAN;
        if ((sharpness == 5.0) && (!NAN(sharpness))) {
          fVar7 = 5.0;
        }
      }
      if (((fVar7 == 5.0) && (!NAN(fVar7))) || ((uVar4 = 0, 0.0 <= fVar7 && (fVar7 <= 4.0)))) {
        uVar3 = 0;
        do {
          *(ulong *)(pfVar5 + uVar3 * 2) = CONCAT44(fVar7,fVar7);
          uVar3 = uVar3 + 1;
        } while (uVar6 != uVar3);
        uVar4 = 1;
      }
    }
  }
  return uVar4;
}

Assistant:

unsigned ON_SubDEdgeSharpness::SetEdgeChainSharpness(
  ON_Interval chain_sharpness_range,
  unsigned edge_count,
  ON_SubDEdgeSharpness* chain_edge_sharpness
)
{
  if (edge_count <= 0 || edge_count >= ON_UNSET_UINT_INDEX || nullptr == chain_edge_sharpness)
    return 0;

  if (chain_sharpness_range[0] == chain_sharpness_range[1])
  {
    const ON_SubDEdgeSharpness c = ON_SubDEdgeSharpness::FromConstant(chain_sharpness_range[0]);
    if (false == c.IsValid(true))
      return 0;
    for (unsigned i = 0; i < edge_count; ++i)
      chain_edge_sharpness[i] = c;
    return 1;
  }

  if (false == ON_SubDEdgeSharpness::IsValidValue(chain_sharpness_range[0], false))
    return false;
  if (false == ON_SubDEdgeSharpness::IsValidValue(chain_sharpness_range[1], false))
    return false;

  const double d = (double)edge_count;
  ON_Interval r(ON_DBL_QNAN, chain_sharpness_range[0]);
  for (unsigned i = 1; i <= edge_count; ++i)
  {
    r.m_t[0] = r.m_t[1];
    r.m_t[1]
      = (i < edge_count)
      ? chain_sharpness_range.ParameterAt(((double)i / d))
      : chain_sharpness_range[1];
    const ON_SubDEdgeSharpness v = ON_SubDEdgeSharpness::FromInterval(r);
    if (v.IsValid())
    {
      chain_edge_sharpness[i - 1] = v;
      continue;
    }
    return 0;
  }

  return
    (chain_edge_sharpness[0].EndSharpness(0) != chain_edge_sharpness[edge_count - 1].EndSharpness(1))
    ? edge_count
    : 1;
}